

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

BailOutInstrTemplate<IR::ProfiledInstr> *
IR::BailOutInstrTemplate<IR::ProfiledInstr>::New
          (OpCode opcode,BailOutKind kind,BailOutInfo *bailOutInfo,Func *func)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this;
  code *pcVar1;
  bool bVar2;
  BailOutKind BVar3;
  undefined4 *puVar4;
  JitArenaAllocator *alloc;
  Type this_00;
  JITOutput *this_01;
  TrackAllocData local_50;
  Type local_28;
  BailOutInstrTemplate<IR::ProfiledInstr> *bailOutInstr;
  Func *func_local;
  BailOutInfo *bailOutInfo_local;
  BailOutKind kind_local;
  OpCode opcode_local;
  
  bailOutInstr = (BailOutInstrTemplate<IR::ProfiledInstr> *)func;
  func_local = (Func *)bailOutInfo;
  bailOutInfo_local._0_4_ = kind;
  bailOutInfo_local._6_2_ = opcode;
  if (func != bailOutInfo->bailOutFunc) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x5c0,"(func == bailOutInfo->bailOutFunc)",
                       "func == bailOutInfo->bailOutFunc");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = IsValidBailOutKindAndBits((BailOutKind)bailOutInfo_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x5c1,"(IsValidBailOutKindAndBits(kind))","IsValidBailOutKindAndBits(kind)")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this = (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
         (bailOutInstr->super_ProfiledInstr).super_Instr._vptr_Instr;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
             ,0x5c2);
  alloc = (JitArenaAllocator *)
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                    (this,&local_50);
  this_00 = (Type)new<Memory::JitArenaAllocator>(0x70,alloc,0x4e98c0);
  BailOutInstrTemplate((BailOutInstrTemplate<IR::ProfiledInstr> *)this_00);
  local_28 = this_00;
  Instr::Init((Instr *)this_00,bailOutInfo_local._6_2_,InstrKindProfiled,(Func *)bailOutInstr);
  *(OpCode *)
   &(func_local->lazyBailoutProperties).
    super_BaseDictionary<int,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    .count = bailOutInfo_local._6_2_;
  (local_28->super_ArenaAllocator).
  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.memoryData =
       (ArenaMemoryData *)func_local;
  *(BailOutKind *)
   &(local_28->super_ArenaAllocator).
    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.needsDelayFreeList =
       (BailOutKind)bailOutInfo_local;
  *(undefined4 *)
   &(local_28->super_ArenaAllocator).
    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.field_0x6c = 0;
  if ((func_local->lazyBailoutProperties).
      super_BaseDictionary<int,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      .alloc == (Type)0x0) {
    (func_local->lazyBailoutProperties).
    super_BaseDictionary<int,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    .alloc = local_28;
  }
  else if (((ulong)func_local->m_alloc & 0x1000000) != 0) {
    bVar2 = Instr::HasBailOutInfo
                      ((Instr *)(func_local->lazyBailoutProperties).
                                super_BaseDictionary<int,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                .alloc);
    if (bVar2) {
      BVar3 = Instr::GetBailOutKind
                        ((Instr *)(func_local->lazyBailoutProperties).
                                  super_BaseDictionary<int,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                  .alloc);
      *(bool *)((long)&func_local->m_alloc + 3) = BVar3 == (BailOutKind)bailOutInfo_local;
    }
    else {
      *(undefined1 *)((long)&func_local->m_alloc + 3) = 0;
    }
  }
  *(uint *)&bailOutInstr[5].super_ProfiledInstr.super_Instr.m_next =
       *(uint *)&bailOutInstr[5].super_ProfiledInstr.super_Instr.m_next & 0xffffffef | 0x10;
  this_01 = Func::GetJITOutput((Func *)bailOutInstr);
  JITOutput::SetHasBailoutInstr(this_01,true);
  return (BailOutInstrTemplate<IR::ProfiledInstr> *)local_28;
}

Assistant:

BailOutInstrTemplate<InstrType> *
BailOutInstrTemplate<InstrType>::New(Js::OpCode opcode, BailOutKind kind, BailOutInfo * bailOutInfo, Func * func)
{
    Assert(func == bailOutInfo->bailOutFunc);
    Assert(IsValidBailOutKindAndBits(kind));
    BailOutInstrTemplate * bailOutInstr = JitAnew(func->m_alloc, BailOutInstrTemplate);
    bailOutInstr->Init(opcode, IRKindMap<InstrType>::InstrKind, func);
#if ENABLE_DEBUG_CONFIG_OPTIONS
    bailOutInfo->bailOutOpcode = opcode;
#endif
    bailOutInstr->bailOutInfo = bailOutInfo;
    bailOutInstr->bailOutKind = kind;
    bailOutInstr->auxBailOutKind = BailOutInvalid;

    if (bailOutInfo->bailOutInstr == nullptr)
    {
        bailOutInfo->bailOutInstr = bailOutInstr;
    }
    else if (bailOutInfo->sharedBailOutKind)
    {
        if (bailOutInfo->bailOutInstr->HasBailOutInfo())
        {
            bailOutInfo->sharedBailOutKind = bailOutInfo->bailOutInstr->GetBailOutKind() ==  kind;
        }
        else
        {
            // Rare cases where we have already generated the bailout record. Unlikely they share the same bailout kind as this is hit only when we try to
            // share bailout in lowerer. See Instr::ShareBailOut.
            bailOutInfo->sharedBailOutKind = false;
        }
    }

    func->hasBailout = true;

    // Indicate that the function has bailout instructions
    // This information is used to determine whether to free jitted loop bodies
    // If the function has bailout instructions, we keep the loop bodies alive
    // in case we bail out to the interpreter, so that we can reuse the jitted
    // loop bodies
    func->GetJITOutput()->SetHasBailoutInstr(true);

    return bailOutInstr;
}